

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O2

void mode_list(cpio *cpio)

{
  long lVar1;
  FILE *pFVar2;
  archive_entry *entry_00;
  int iVar3;
  wchar_t wVar4;
  mode_t mVar5;
  uint uVar6;
  archive *a;
  la_int64_t lVar7;
  char *pcVar8;
  dev_t dVar9;
  dev_t dVar10;
  time_t tVar11;
  tm *__tp;
  char *pcVar12;
  bool bVar13;
  archive_entry *entry;
  char *local_128;
  archive *local_120;
  char *local_118;
  name_cache **local_110;
  name_cache **local_108;
  cpio *local_100;
  FILE *local_f8;
  time_t mtime;
  char date [32];
  char size [32];
  char gids [22];
  char uids [22];
  tm local_68;
  
  a = archive_read_new();
  if (a == (archive *)0x0) {
    lafe_errc(1,0,"Couldn\'t allocate archive object");
  }
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  if (cpio->option_pwb != 0) {
    archive_read_set_options(a,"pwb");
  }
  if (cpio->passphrase == (char *)0x0) {
    iVar3 = archive_read_set_passphrase_callback(a,cpio,passphrase_callback);
  }
  else {
    iVar3 = archive_read_add_passphrase(a,cpio->passphrase);
  }
  if (iVar3 == 0) {
    wVar4 = archive_read_open_filename(a,cpio->filename,(long)cpio->bytes_per_block);
    if (wVar4 == L'\0') {
      local_108 = &cpio->uname_cache;
      local_110 = &cpio->gname_cache;
      local_120 = a;
      local_100 = cpio;
      while( true ) {
        iVar3 = archive_read_next_header(a,&entry);
        if (iVar3 != 0) break;
        wVar4 = archive_match_path_excluded(cpio->matching,entry);
        entry_00 = entry;
        pFVar2 = _stdout;
        if (wVar4 == L'\0') {
          if (cpio->verbose == 0) {
            pcVar8 = archive_entry_pathname(entry);
            fprintf(pFVar2,"%s\n",pcVar8);
          }
          else {
            if (list_item_verbose_now == 0) {
              time(&list_item_verbose_now);
            }
            local_f8 = pFVar2;
            if (cpio->option_numeric_uid_gid == 0) {
              pcVar8 = archive_entry_uname(entry_00);
              if (pcVar8 == (char *)0x0) {
                lVar7 = archive_entry_uid(entry_00);
                pcVar8 = lookup_name(cpio,local_108,lookup_uname_helper,(id_t)lVar7);
              }
              local_118 = pcVar8;
              pcVar8 = archive_entry_gname(entry_00);
              if (pcVar8 == (char *)0x0) {
                lVar7 = archive_entry_gid(entry_00);
                pcVar8 = lookup_name(cpio,local_110,lookup_gname_helper,(id_t)lVar7);
              }
            }
            else {
              lVar7 = archive_entry_uid(entry_00);
              pcVar8 = cpio_i64toa(lVar7);
              strcpy(uids,pcVar8);
              lVar7 = archive_entry_gid(entry_00);
              pcVar8 = cpio_i64toa(lVar7);
              strcpy(gids,pcVar8);
              pcVar8 = gids;
              local_118 = uids;
            }
            local_128 = pcVar8;
            mVar5 = archive_entry_filetype(entry_00);
            if ((mVar5 == 0x2000) || (mVar5 = archive_entry_filetype(entry_00), mVar5 == 0x6000)) {
              dVar9 = archive_entry_rdevmajor(entry_00);
              dVar10 = archive_entry_rdevminor(entry_00);
              snprintf(size,0x20,"%lu,%lu",dVar9,dVar10);
            }
            else {
              lVar7 = archive_entry_size(entry_00);
              pcVar8 = cpio_i64toa(lVar7);
              strcpy(size,pcVar8);
            }
            tVar11 = archive_entry_mtime(entry_00);
            lVar1 = list_item_verbose_now;
            iVar3 = cpio->day_first;
            mtime = tVar11;
            __tp = localtime_r(&mtime,&local_68);
            if (__tp == (tm *)0x0) {
              builtin_strncpy(date + 8,"mtime",6);
              builtin_strncpy(date,"invalid ",8);
            }
            else {
              bVar13 = iVar3 == 0;
              pcVar8 = "%e %b  %Y";
              if (bVar13) {
                pcVar8 = "%b %e  %Y";
              }
              pcVar12 = "%e %b %H:%M";
              if (bVar13) {
                pcVar12 = "%b %e %H:%M";
              }
              if ((tVar11 - lVar1) - 0xf099c1U < 0xfffffffffe1ecc7f) {
                pcVar12 = pcVar8;
              }
              strftime(date,0x20,pcVar12,__tp);
            }
            a = local_120;
            pcVar8 = archive_entry_strmode((archive_entry_conflict *)entry_00);
            uVar6 = archive_entry_nlink(entry_00);
            pcVar12 = archive_entry_pathname(entry_00);
            pFVar2 = local_f8;
            fprintf(local_f8,"%s%3u %-8s %-8s %8s %12s %s",pcVar8,(ulong)uVar6,local_118,local_128,
                    size,date,pcVar12);
            pcVar8 = archive_entry_hardlink(entry_00);
            if (pcVar8 == (char *)0x0) {
              pcVar8 = archive_entry_symlink(entry_00);
              if (pcVar8 != (char *)0x0) {
                pcVar8 = archive_entry_symlink(entry_00);
                pcVar12 = " -> %s";
                goto LAB_0010a833;
              }
            }
            else {
              pcVar8 = archive_entry_hardlink(entry_00);
              pcVar12 = " link to %s";
LAB_0010a833:
              fprintf(pFVar2,pcVar12,pcVar8);
            }
            fputc(10,pFVar2);
            cpio = local_100;
          }
        }
      }
      if (iVar3 == 1) {
        iVar3 = archive_read_close(a);
        if (iVar3 == 0) {
          if (cpio->quiet == 0) {
            lVar7 = archive_filter_bytes(a,0);
            pcVar8 = "blocks";
            if (lVar7 - 1U < 0x200) {
              pcVar8 = "block";
            }
            fprintf(_stderr,"%lu %s\n",(lVar7 + 0x1ff) / 0x200,pcVar8);
          }
          archive_read_free(a);
          exit(0);
        }
        goto LAB_0010a8d5;
      }
    }
    iVar3 = archive_errno(a);
    pcVar8 = archive_error_string(a);
  }
  else {
LAB_0010a8d5:
    pcVar8 = archive_error_string(a);
    iVar3 = 0;
  }
  lafe_errc(1,iVar3,"%s",pcVar8);
}

Assistant:

static void
mode_list(struct cpio *cpio)
{
	struct archive *a;
	struct archive_entry *entry;
	int r;

	a = archive_read_new();
	if (a == NULL)
		lafe_errc(1, 0, "Couldn't allocate archive object");
	archive_read_support_filter_all(a);
	archive_read_support_format_all(a);
	if (cpio->option_pwb)
		archive_read_set_options(a, "pwb");
	if (cpio->passphrase != NULL)
		r = archive_read_add_passphrase(a, cpio->passphrase);
	else
		r = archive_read_set_passphrase_callback(a, cpio,
			&passphrase_callback);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));

	if (archive_read_open_filename(a, cpio->filename,
					cpio->bytes_per_block))
		lafe_errc(1, archive_errno(a),
		    "%s", archive_error_string(a));
	for (;;) {
		r = archive_read_next_header(a, &entry);
		if (r == ARCHIVE_EOF)
			break;
		if (r != ARCHIVE_OK) {
			lafe_errc(1, archive_errno(a),
			    "%s", archive_error_string(a));
		}
		if (archive_match_path_excluded(cpio->matching, entry))
			continue;
		if (cpio->verbose)
			list_item_verbose(cpio, entry);
		else
			fprintf(stdout, "%s\n", archive_entry_pathname(entry));
	}
	r = archive_read_close(a);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (!cpio->quiet) {
		int64_t blocks = (archive_filter_bytes(a, 0) + 511)
			      / 512;
		fprintf(stderr, "%lu %s\n", (unsigned long)blocks,
		    blocks == 1 ? "block" : "blocks");
	}
	archive_read_free(a);
	exit(0);
}